

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O1

void Assimp::FindAABBTransformed(aiMesh *mesh,aiVector3D *min,aiVector3D *max,aiMatrix4x4 *m)

{
  aiVector3D *paVar1;
  long lVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  min->x = 1e+11;
  min->y = 1e+11;
  min->z = 1e+11;
  max->x = -1e+11;
  max->y = -1e+11;
  max->z = -1e+11;
  if (mesh->mNumVertices != 0) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      paVar1 = mesh->mVertices;
      fVar6 = *(float *)((long)paVar1 + lVar2 + -8);
      fVar4 = *(float *)((long)paVar1 + lVar2 + -4);
      fVar7 = *(float *)((long)&paVar1->x + lVar2);
      fVar5 = m->a3 * fVar7 + m->a1 * fVar6 + m->a2 * fVar4 + m->a4;
      fVar8 = m->b3 * fVar7 + m->b1 * fVar6 + m->b2 * fVar4 + m->b4;
      fVar4 = fVar7 * m->c3 + fVar6 * m->c1 + fVar4 * m->c2 + m->c4;
      fVar6 = min->x;
      if (fVar5 <= min->x) {
        fVar6 = fVar5;
      }
      fVar7 = min->y;
      if (fVar8 <= min->y) {
        fVar7 = fVar8;
      }
      fVar9 = min->z;
      if (fVar4 <= min->z) {
        fVar9 = fVar4;
      }
      min->x = fVar6;
      min->y = fVar7;
      min->z = fVar9;
      fVar6 = max->x;
      if (max->x <= fVar5) {
        fVar6 = fVar5;
      }
      fVar7 = max->y;
      if (max->y <= fVar8) {
        fVar7 = fVar8;
      }
      fVar5 = max->z;
      if (max->z <= fVar4) {
        fVar5 = fVar4;
      }
      max->x = fVar6;
      max->y = fVar7;
      max->z = fVar5;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0xc;
    } while (uVar3 < mesh->mNumVertices);
  }
  return;
}

Assistant:

void FindAABBTransformed (const aiMesh* mesh, aiVector3D& min, aiVector3D& max,
    const aiMatrix4x4& m)
{
    min = aiVector3D ( ai_real( 10e10 ), ai_real( 10e10 ), ai_real( 10e10 ) );
    max = aiVector3D ( ai_real( -10e10 ), ai_real( -10e10 ), ai_real( -10e10 ) );
    for (unsigned int i = 0;i < mesh->mNumVertices;++i)
    {
        const aiVector3D v = m * mesh->mVertices[i];
        min = std::min(v,min);
        max = std::max(v,max);
    }
}